

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O1

void __thiscall
icu_63::CollationIterator::appendNumericCEs
          (CollationIterator *this,uint32_t ce32,UBool forward,UErrorCode *errorCode)

{
  ulong uVar1;
  char cVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  ulong uVar9;
  CharString digits;
  CharString local_68;
  
  MaybeStackArray<char,_40>::MaybeStackArray(&local_68.buffer);
  local_68.len = 0;
  *local_68.buffer.ptr = '\0';
  if (forward == '\0') {
    do {
      CharString::append(&local_68,(byte)(ce32 >> 8) & 0xf,errorCode);
      iVar5 = (*(this->super_UObject)._vptr_UObject[7])(this,errorCode);
      if (iVar5 < 0) {
LAB_0023b4ee:
        bVar4 = false;
      }
      else {
        ce32 = CollationData::getCE32(this->data,iVar5);
        if (ce32 == 0xc0) {
          ce32 = CollationData::getCE32(this->data->base,iVar5);
        }
        bVar4 = true;
        if ((ce32 & 0xcf) != 0xca) {
          (*(this->super_UObject)._vptr_UObject[0xc])(this,1,errorCode);
          goto LAB_0023b4ee;
        }
      }
    } while (bVar4);
    pcVar7 = local_68.buffer.ptr + (long)local_68.len + -1;
    pcVar3 = local_68.buffer.ptr;
    if (local_68.buffer.ptr < pcVar7) {
      do {
        pcVar6 = pcVar3 + 1;
        cVar2 = *pcVar3;
        *pcVar3 = *pcVar7;
        *pcVar7 = cVar2;
        pcVar7 = pcVar7 + -1;
        pcVar3 = pcVar6;
      } while (pcVar6 < pcVar7);
    }
  }
  else {
    do {
      CharString::append(&local_68,(byte)(ce32 >> 8) & 0xf,errorCode);
      if ((this->numCpFwd == 0) ||
         (iVar5 = (*(this->super_UObject)._vptr_UObject[6])(this,errorCode), iVar5 < 0)) {
LAB_0023b46c:
        bVar4 = false;
      }
      else {
        ce32 = CollationData::getCE32(this->data,iVar5);
        if (ce32 == 0xc0) {
          ce32 = CollationData::getCE32(this->data->base,iVar5);
        }
        if ((ce32 & 0xcf) != 0xca) {
          (*(this->super_UObject)._vptr_UObject[0xd])(this,1,errorCode);
          goto LAB_0023b46c;
        }
        bVar4 = true;
        if (0 < this->numCpFwd) {
          this->numCpFwd = this->numCpFwd + -1;
        }
      }
    } while (bVar4);
  }
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar9 = 0;
    do {
      uVar1 = (long)local_68.len - 1;
      if ((int)uVar9 < (int)uVar1) {
        uVar9 = (ulong)(int)uVar9;
        do {
          if (local_68.buffer.ptr[uVar9] != '\0') goto LAB_0023b55a;
          uVar9 = uVar9 + 1;
        } while ((long)uVar9 < (long)uVar1);
        uVar9 = uVar1 & 0xffffffff;
      }
LAB_0023b55a:
      iVar8 = (int)uVar9;
      iVar5 = local_68.len - iVar8;
      if (0xfd < local_68.len - iVar8) {
        iVar5 = 0xfe;
      }
      appendNumericSegmentCEs(this,local_68.buffer.ptr + iVar8,iVar5,errorCode);
    } while ((*errorCode < U_ILLEGAL_ARGUMENT_ERROR) &&
            (uVar9 = (ulong)(uint)(iVar5 + iVar8), iVar5 + iVar8 < local_68.len));
  }
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_68.buffer);
  return;
}

Assistant:

void
CollationIterator::appendNumericCEs(uint32_t ce32, UBool forward, UErrorCode &errorCode) {
    // Collect digits.
    CharString digits;
    if(forward) {
        for(;;) {
            char digit = Collation::digitFromCE32(ce32);
            digits.append(digit, errorCode);
            if(numCpFwd == 0) { break; }
            UChar32 c = nextCodePoint(errorCode);
            if(c < 0) { break; }
            ce32 = data->getCE32(c);
            if(ce32 == Collation::FALLBACK_CE32) {
                ce32 = data->base->getCE32(c);
            }
            if(!Collation::hasCE32Tag(ce32, Collation::DIGIT_TAG)) {
                backwardNumCodePoints(1, errorCode);
                break;
            }
            if(numCpFwd > 0) { --numCpFwd; }
        }
    } else {
        for(;;) {
            char digit = Collation::digitFromCE32(ce32);
            digits.append(digit, errorCode);
            UChar32 c = previousCodePoint(errorCode);
            if(c < 0) { break; }
            ce32 = data->getCE32(c);
            if(ce32 == Collation::FALLBACK_CE32) {
                ce32 = data->base->getCE32(c);
            }
            if(!Collation::hasCE32Tag(ce32, Collation::DIGIT_TAG)) {
                forwardNumCodePoints(1, errorCode);
                break;
            }
        }
        // Reverse the digit string.
        char *p = digits.data();
        char *q = p + digits.length() - 1;
        while(p < q) {
            char digit = *p;
            *p++ = *q;
            *q-- = digit;
        }
    }
    if(U_FAILURE(errorCode)) { return; }
    int32_t pos = 0;
    do {
        // Skip leading zeros.
        while(pos < (digits.length() - 1) && digits[pos] == 0) { ++pos; }
        // Write a sequence of CEs for at most 254 digits at a time.
        int32_t segmentLength = digits.length() - pos;
        if(segmentLength > 254) { segmentLength = 254; }
        appendNumericSegmentCEs(digits.data() + pos, segmentLength, errorCode);
        pos += segmentLength;
    } while(U_SUCCESS(errorCode) && pos < digits.length());
}